

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O3

PVG_FT_Outline *
ft_outline_convert(plutovg_path_t *path,plutovg_matrix_t *matrix,plutovg_stroke_data_t *stroke_data)

{
  PVG_FT_Vector *pPVar1;
  float fVar2;
  float fVar3;
  plutovg_line_cap_t pVar4;
  plutovg_line_join_t pVar5;
  double dVar6;
  PVG_FT_Pos PVar7;
  _Bool _Var8;
  plutovg_path_command_t pVar9;
  plutovg_path_t *path_00;
  PVG_FT_Outline *outline;
  char *pcVar10;
  long lVar11;
  PVG_FT_Outline *outline_00;
  int iVar12;
  PVG_FT_Vector *pPVar13;
  PVG_FT_Stroker_LineCap line_cap;
  PVG_FT_Stroker_LineJoin line_join;
  plutovg_point_t points [3];
  plutovg_path_iterator_t it;
  plutovg_point_t local_78;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  plutovg_matrix_t *local_58;
  plutovg_path_t *local_50;
  PVG_FT_UInt local_44;
  plutovg_path_iterator_t local_40;
  
  if (stroke_data == (plutovg_stroke_data_t *)0x0) {
    plutovg_path_iterator_init(&local_40,path);
    outline_00 = ft_outline_create(path->num_points,path->num_contours);
    _Var8 = plutovg_path_iterator_has_next(&local_40);
    if (_Var8) {
      do {
        pVar9 = plutovg_path_iterator_next(&local_40,&local_78);
        switch(pVar9) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
          plutovg_matrix_map_points(matrix,&local_78,&local_78,1);
          pPVar13 = outline_00->points;
          iVar12 = outline_00->n_points;
          pPVar13[iVar12].x = (long)(local_78.x * 64.0);
          pPVar13[iVar12].y = (long)(local_78.y * 64.0);
          outline_00->tags[iVar12] = '\x01';
          iVar12 = outline_00->n_contours;
          if (outline_00->n_points != 0) {
            outline_00->contours[iVar12] = outline_00->n_points + -1;
            iVar12 = outline_00->n_contours + 1;
            outline_00->n_contours = iVar12;
          }
          pcVar10 = outline_00->contours_flag + iVar12;
          goto LAB_0010bcfd;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
          plutovg_matrix_map_points(matrix,&local_78,&local_78,1);
          pPVar13 = outline_00->points;
          lVar11 = (long)outline_00->n_points;
          fVar2 = local_78.x;
          fVar3 = local_78.y;
          break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
          plutovg_matrix_map_points(matrix,&local_78,&local_78,3);
          pPVar13 = outline_00->points;
          iVar12 = outline_00->n_points;
          pPVar13[iVar12].x = (long)(local_78.x * 64.0);
          pPVar13[iVar12].y = (long)(local_78.y * 64.0);
          outline_00->tags[iVar12] = '\x02';
          iVar12 = outline_00->n_points;
          lVar11 = (long)iVar12 + 1;
          outline_00->n_points = (int)lVar11;
          pPVar13 = outline_00->points;
          pPVar13[lVar11].x = (long)(local_70 * 64.0);
          pPVar13[lVar11].y = (long)(local_6c * 64.0);
          outline_00->tags[(long)iVar12 + 1] = '\x02';
          lVar11 = (long)outline_00->n_points + 1;
          outline_00->n_points = (int)lVar11;
          pPVar13 = outline_00->points;
          fVar2 = local_68;
          fVar3 = local_64;
          break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
          outline_00->contours_flag[outline_00->n_contours] = '\0';
          if ((long)outline_00->n_contours == 0) {
            iVar12 = 0;
          }
          else {
            iVar12 = outline_00->contours[(long)outline_00->n_contours + -1] + 1;
          }
          lVar11 = (long)outline_00->n_points;
          if (iVar12 == outline_00->n_points) goto switchD_0010bb35_default;
          pPVar13 = outline_00->points + iVar12;
          PVar7 = pPVar13->y;
          pPVar1 = outline_00->points + lVar11;
          pPVar1->x = pPVar13->x;
          pPVar1->y = PVar7;
          goto LAB_0010bcf9;
        default:
          goto switchD_0010bb35_default;
        }
        pPVar13[lVar11].x = (long)(fVar2 * 64.0);
        pPVar13[lVar11].y = (long)(fVar3 * 64.0);
LAB_0010bcf9:
        pcVar10 = outline_00->tags + lVar11;
LAB_0010bcfd:
        *pcVar10 = '\x01';
        outline_00->n_points = outline_00->n_points + 1;
switchD_0010bb35_default:
        _Var8 = plutovg_path_iterator_has_next(&local_40);
      } while (_Var8);
    }
    if (outline_00->n_points != 0) {
      outline_00->contours[outline_00->n_contours] = outline_00->n_points + -1;
      outline_00->n_contours = outline_00->n_contours + 1;
    }
  }
  else {
    local_50 = path;
    dVar6 = hypot(SQRT((double)(matrix->a * matrix->a + matrix->b * matrix->b)),
                  SQRT((double)(matrix->c * matrix->c + matrix->d * matrix->d)));
    fVar2 = (stroke_data->style).miter_limit;
    pVar4 = (stroke_data->style).cap;
    pVar5 = (stroke_data->style).join;
    line_cap = (PVG_FT_Stroker_LineCap)(pVar4 == PLUTOVG_LINE_CAP_ROUND);
    if (pVar4 == PLUTOVG_LINE_CAP_SQUARE) {
      line_cap = PVG_FT_STROKER_LINECAP_SQUARE;
    }
    line_join = PVG_FT_STROKER_LINEJOIN_BEVEL;
    if (pVar5 != PLUTOVG_LINE_JOIN_BEVEL) {
      line_join = (uint)(pVar5 != PLUTOVG_LINE_JOIN_ROUND) * 3;
    }
    fVar3 = (stroke_data->style).width;
    local_58 = matrix;
    PVG_FT_Stroker_New((PVG_FT_Stroker *)&local_78);
    PVG_FT_Stroker_Set((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),
                       (long)((double)fVar3 * (dVar6 / 1.4142135381698608) * 0.5 * 64.0),line_cap,
                       line_join,(long)(fVar2 * 65536.0));
    iVar12 = (stroke_data->dash).array.size;
    if (iVar12 == 0) {
      outline = ft_outline_convert(local_50,local_58,(plutovg_stroke_data_t *)0x0);
    }
    else {
      path_00 = plutovg_path_clone_dashed
                          (local_50,(stroke_data->dash).offset,(stroke_data->dash).array.data,iVar12
                          );
      outline = ft_outline_convert(path_00,local_58,(plutovg_stroke_data_t *)0x0);
      plutovg_path_destroy(path_00);
    }
    PVG_FT_Stroker_ParseOutline((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),outline);
    PVG_FT_Stroker_GetCounts
              ((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),(PVG_FT_UInt *)&local_40,&local_44);
    outline_00 = ft_outline_create((int)local_40.elements,local_44);
    PVG_FT_Stroker_Export((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),outline_00);
    PVG_FT_Stroker_Done((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x));
    free(outline);
  }
  return outline_00;
}

Assistant:

static PVG_FT_Outline* ft_outline_convert(const plutovg_path_t* path, const plutovg_matrix_t* matrix, const plutovg_stroke_data_t* stroke_data)
{
    if(stroke_data) {
        return ft_outline_convert_stroke(path, matrix, stroke_data);
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    PVG_FT_Outline* outline = ft_outline_create(path->num_points, path->num_contours);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_move_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_line_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            ft_outline_cubic_to(outline, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            ft_outline_close(outline);
            break;
        }
    }

    ft_outline_end(outline);
    return outline;
}